

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::framebufferRenderbuffer
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 renderbuffertarget,
          deUint32 renderbuffer)

{
  Framebuffer *pFVar1;
  Framebuffer *pFVar2;
  Renderbuffer *pRVar3;
  int iVar4;
  Framebuffer *pFVar5;
  int iVar6;
  Attachment *attachment_00;
  bool bVar7;
  long lStack_50;
  
  if (attachment == 0x8d20) {
    lStack_50 = 2;
LAB_0152ac94:
    bVar7 = false;
  }
  else if (attachment == 0x8ce0) {
    bVar7 = false;
    lStack_50 = 0;
  }
  else {
    if (attachment == 0x8d00) {
      lStack_50 = 1;
      goto LAB_0152ac94;
    }
    if (attachment == 0x821a) {
      (*(this->super_Context)._vptr_Context[0x20])
                (this,(ulong)target,0x8d00,(ulong)renderbuffertarget,(ulong)renderbuffer);
      (*(this->super_Context)._vptr_Context[0x20])
                (this,(ulong)target,0x8d20,(ulong)renderbuffertarget,(ulong)renderbuffer);
      return;
    }
    lStack_50 = 3;
    bVar7 = true;
  }
  if (((1 < target - 0x8ca8) && (target != 0x8d40)) || (bVar7)) {
LAB_0152acb7:
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
    }
  }
  else {
    pFVar1 = this->m_readFramebufferBinding;
    pFVar2 = this->m_drawFramebufferBinding;
    pFVar5 = pFVar1;
    if (target == 0x8ca9) {
      pFVar5 = pFVar2;
    }
    if (target == 0x8d40) {
      pFVar5 = pFVar2;
    }
    if (pFVar5 == (Framebuffer *)0x0) {
LAB_0152ad53:
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
    if (renderbuffer == 0) {
      pRVar3 = (Renderbuffer *)0x0;
    }
    else {
      pRVar3 = rc::ObjectManager<sglr::rc::Renderbuffer>::find(&this->m_renderbuffers,renderbuffer);
      if (renderbuffertarget != 0x8d41) goto LAB_0152acb7;
      if (pRVar3 == (Renderbuffer *)0x0) goto LAB_0152ad53;
    }
    iVar6 = (uint)(pFVar5 == pFVar1) + (uint)(pFVar5 == pFVar2);
    attachment_00 = pFVar5->m_attachments + lStack_50;
    iVar4 = iVar6;
    while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
      releaseFboAttachmentReference(this,attachment_00);
    }
    attachment_00->type = ATTACHMENTTYPE_LAST;
    attachment_00->name = 0;
    pFVar5->m_attachments[lStack_50].texTarget = TEXTARGET_LAST;
    pFVar5->m_attachments[lStack_50].level = 0;
    pFVar5->m_attachments[lStack_50].layer = 0;
    if (pRVar3 != (Renderbuffer *)0x0) {
      attachment_00->type = ATTACHMENTTYPE_RENDERBUFFER;
      pFVar5->m_attachments[lStack_50].name = (pRVar3->super_NamedObject).m_name;
      while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
        acquireFboAttachmentReference(this,attachment_00);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::framebufferRenderbuffer (deUint32 target, deUint32 attachment, deUint32 renderbuffertarget, deUint32 renderbuffer)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach both to depth and stencil.
		framebufferRenderbuffer(target, GL_DEPTH_ATTACHMENT,	renderbuffertarget, renderbuffer);
		framebufferRenderbuffer(target, GL_STENCIL_ATTACHMENT,	renderbuffertarget, renderbuffer);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Renderbuffer*					rbo				= DE_NULL;

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (renderbuffer != 0)
		{
			rbo = m_renderbuffers.find(renderbuffer);

			RC_IF_ERROR(renderbuffertarget != GL_RENDERBUFFER,	GL_INVALID_ENUM,		RC_RET_VOID);
			RC_IF_ERROR(!rbo,									GL_INVALID_OPERATION,	RC_RET_VOID);
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (rbo)
		{
			fboAttachment.type	= Framebuffer::ATTACHMENTTYPE_RENDERBUFFER;
			fboAttachment.name	= rbo->getName();

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}